

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

int c2w(int c_count,char *c,int w_count,wchar_t *w)

{
  char *local_40;
  char *p1;
  ON__UINT32 error_code_point;
  uint error_mask;
  uint error_status;
  int rc;
  wchar_t *w_local;
  char *pcStack_18;
  int w_count_local;
  char *c_local;
  int c_count_local;
  
  error_mask = 0;
  if (w != (wchar_t *)0x0) {
    *w = L'\0';
  }
  if (((((0 < w_count) && (w != (wchar_t *)0x0)) && (0 < c_count)) &&
      ((c != (char *)0x0 && (*c != '\0')))) && (*w = L'\0', c != (char *)0x0)) {
    error_code_point = 0;
    p1._4_4_ = 0xffffffff;
    p1._0_4_ = 0xfffd;
    local_40 = (char *)0x0;
    _error_status = w;
    w_local._4_4_ = w_count;
    pcStack_18 = c;
    c_local._4_4_ = c_count;
    error_mask = ON_ConvertUTF8ToWideChar
                           (0,c,c_count,w,w_count,&error_code_point,0xffffffff,0xfffd,&local_40);
    if (((int)error_mask < 1) || (w_local._4_4_ < (int)error_mask)) {
      _error_status[w_local._4_4_] = L'\0';
      error_mask = 0;
    }
    else {
      _error_status[(int)error_mask] = L'\0';
    }
    if (error_code_point != 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_wstring.cpp"
                 ,0x78,"",
                 "Error converting UTF-8 encoded char string to UTF-16 encoded wchar_t string.");
    }
  }
  return error_mask;
}

Assistant:

static int c2w( int c_count,
                const char* c,
                int w_count,
                wchar_t* w // array of at least w_count+1 wide characters
                )
{
  // convert UTF-8 string to UTF-16 string
  int rc = 0;
  if ( w )
    w[0] = 0;
  // returns length of converted c[]
  if ( w_count > 0 && w && c_count > 0 && c && c[0] ) {
    w[0] = 0;
    if ( c )
    {
      unsigned int error_status = 0;
      unsigned int error_mask = 0xFFFFFFFF;
      ON__UINT32 error_code_point = 0xFFFD;
      const char* p1 = 0;
      rc = ON_ConvertUTF8ToWideChar(false,c,c_count,w,w_count,&error_status,error_mask,error_code_point,&p1);
      if ( rc > 0 && rc <= w_count )
        w[rc] = 0;
      else {
        w[w_count] = 0;
        rc = 0;
      }
      if ( 0 != error_status )
      {
        ON_ERROR("Error converting UTF-8 encoded char string to UTF-16 encoded wchar_t string.");
      }
    }
  }
	return rc;
}